

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O3

gs_stmt_t * gs_parse_stmt_block(gs_parser_t *parser)

{
  gs_token_t *pgVar1;
  char *__src;
  int iVar2;
  gs_stmt_t *pgVar3;
  gs_stmt_t *pgVar4;
  gs_expr_t **__dest;
  long lVar5;
  char *local_48;
  int aiStack_40 [2];
  char *local_38;
  
  local_48 = (char *)0x0;
  aiStack_40[0] = 0;
  aiStack_40[1] = 0;
  local_38 = "script/parser";
  pgVar1 = (parser->tokens).data;
  iVar2 = parser->cur_token;
  if ((pgVar1[iVar2].type != GS_TOKEN_CHAR) || (pgVar1[iVar2].field_3.c != '}')) {
    pgVar4 = (gs_stmt_t *)0x0;
    do {
      pgVar3 = gs_parse_stmt(parser);
      if (parser->error != false) goto LAB_001398dd;
      iVar2 = vec_expand_(&local_48,aiStack_40,aiStack_40 + 1,8,local_38);
      if (iVar2 == 0) {
        lVar5 = (long)aiStack_40[0];
        aiStack_40[0] = aiStack_40[0] + 1;
        *(gs_stmt_t **)(local_48 + lVar5 * 8) = pgVar3;
      }
      pgVar1 = (parser->tokens).data;
      iVar2 = parser->cur_token;
    } while ((pgVar1[iVar2].type != GS_TOKEN_CHAR) || (pgVar1[iVar2].field_3.c != '}'));
  }
  __src = local_48;
  if (iVar2 < (parser->tokens).length) {
    parser->cur_token = iVar2 + 1;
  }
  iVar2 = aiStack_40[0];
  lVar5 = (long)aiStack_40[0];
  pgVar4 = (gs_stmt_t *)gs_parser_alloc(parser,0x48);
  pgVar4->type = GS_STMT_BLOCK;
  (pgVar4->field_1).if_stmt.num_conds = iVar2;
  __dest = (gs_expr_t **)gs_parser_alloc(parser,lVar5 << 3);
  (pgVar4->field_1).if_stmt.conds = __dest;
  memcpy(__dest,__src,lVar5 << 3);
LAB_001398dd:
  golf_free_tracked(local_48);
  return pgVar4;
}

Assistant:

static gs_stmt_t *gs_parse_stmt_block(gs_parser_t *parser) {
    vec_gs_stmt_t stmts;
    vec_init(&stmts, "script/parser");

    gs_token_t token = gs_peek(parser);
    gs_stmt_t *stmt = NULL;

    while (!gs_eat_char(parser, '}')) {
        gs_stmt_t *stmt = gs_parse_stmt(parser);
        if (parser->error) goto cleanup;

        vec_push(&stmts, stmt);
    }

    stmt = gs_stmt_block_new(parser, token, stmts);

cleanup:
    vec_deinit(&stmts);
    return stmt;
}